

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicorn.c
# Opt level: O2

uc_err reg_read_ppc(void *_env,int mode,uint regid,void *value,size_t *size)

{
  undefined4 uVar1;
  long lVar2;
  uint uVar3;
  
  if (regid - 2 < 0x20) {
    if (3 < *size) {
      *size = 4;
      uVar1 = *(undefined4 *)((long)_env + (ulong)(regid - 2) * 4);
      goto LAB_0091c70c;
    }
  }
  else if (regid - 0x2a < 0x20) {
    if (7 < *size) {
      *size = 8;
      *(undefined8 *)value = *(undefined8 *)((long)_env + (ulong)(regid - 0x2a) * 0x10 + 0x112c8);
      return UC_ERR_OK;
    }
  }
  else if (regid - 0x22 < 8) {
    if (3 < *size) {
      *size = 4;
      uVar1 = *(undefined4 *)((long)_env + (ulong)(regid - 0x22) * 4 + 0x108);
      goto LAB_0091c70c;
    }
  }
  else {
    switch(regid) {
    case 0x4a:
      if (3 < *size) {
        *size = 4;
        uVar1 = *(undefined4 *)((long)_env + 0x100);
LAB_0091c70c:
        *(undefined4 *)value = uVar1;
        return UC_ERR_OK;
      }
      break;
    case 0x4b:
      if (3 < *size) {
        *size = 4;
        uVar1 = *(undefined4 *)((long)_env + 0x128);
        goto LAB_0091c70c;
      }
      break;
    case 0x4c:
      if (3 < *size) {
        *size = 4;
        uVar1 = *(undefined4 *)((long)_env + 0x104);
        goto LAB_0091c70c;
      }
      break;
    case 0x4d:
      if (3 < *size) {
        *size = 4;
        uVar1 = *(undefined4 *)((long)_env + 0x14c);
        goto LAB_0091c70c;
      }
      break;
    case 0x4e:
      if (3 < *size) {
        *size = 4;
        uVar1 = *(undefined4 *)((long)_env + 0x116ec);
        goto LAB_0091c70c;
      }
      break;
    case 0x4f:
      if (3 < *size) {
        *size = 4;
        uVar3 = 0;
        for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 1) {
          uVar3 = uVar3 << 4 | *(uint *)((long)_env + lVar2 * 4 + 0x108);
        }
        *(uint *)value = uVar3;
        return UC_ERR_OK;
      }
      break;
    default:
      if (regid != 1) {
        return UC_ERR_ARG;
      }
      if (3 < *size) {
        *size = 4;
        uVar1 = *(undefined4 *)((long)_env + 0x160);
        goto LAB_0091c70c;
      }
    }
  }
  return UC_ERR_OVERFLOW;
}

Assistant:

DEFAULT_VISIBILITY
uc_err reg_read(void *_env, int mode, unsigned int regid, void *value,
                size_t *size)
{
    CPUPPCState *env = _env;
    uc_err ret = UC_ERR_ARG;

    if (regid >= UC_PPC_REG_0 && regid <= UC_PPC_REG_31) {
        CHECK_REG_TYPE(ppcreg_t);
        *(ppcreg_t *)value = env->gpr[regid - UC_PPC_REG_0];
    } else if (regid >= UC_PPC_REG_FPR0 && regid <= UC_PPC_REG_FPR31) {
        CHECK_REG_TYPE(uint64_t);
        *(uint64_t *)value = env->vsr[regid - UC_PPC_REG_FPR0].VsrD(0);
    } else if (regid >= UC_PPC_REG_CR0 && regid <= UC_PPC_REG_CR7) {
        CHECK_REG_TYPE(uint32_t);
        *(uint32_t *)value = env->crf[regid - UC_PPC_REG_CR0];
    } else {
        switch (regid) {
        default:
            break;
        case UC_PPC_REG_PC:
            CHECK_REG_TYPE(ppcreg_t);
            *(ppcreg_t *)value = env->nip;
            break;
        case UC_PPC_REG_CR: {
            CHECK_REG_TYPE(uint32_t);
            int i;
            uint32_t val = 0;
            for (i = 0; i < 8; i++) {
                val <<= 4;
                val |= env->crf[i];
            }
            *(uint32_t *)value = val;
            break;
        }
        case UC_PPC_REG_LR:
            CHECK_REG_TYPE(ppcreg_t);
            *(ppcreg_t *)value = env->lr;
            break;
        case UC_PPC_REG_CTR:
            CHECK_REG_TYPE(ppcreg_t);
            *(ppcreg_t *)value = env->ctr;
            break;
        case UC_PPC_REG_MSR:
            CHECK_REG_TYPE(ppcreg_t);
            *(ppcreg_t *)value = env->msr;
            break;
        case UC_PPC_REG_XER:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = env->xer;
            break;
        case UC_PPC_REG_FPSCR:
            CHECK_REG_TYPE(uint32_t);
            *(uint32_t *)value = env->fpscr;
            break;
        }
    }

    return ret;
}